

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

size_t __thiscall
c4::basic_substring<char>::last_not_of(basic_substring<char> *this,char c,size_t start)

{
  code *pcVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  
  if (start <= this->len || start == 0xffffffffffffffff) {
    uVar6 = this->len;
    if (start != 0xffffffffffffffff) {
      uVar6 = start;
    }
    do {
      uVar4 = uVar6 - 1;
      if (uVar6 == 0) {
        return 0xffffffffffffffff;
      }
      lVar2 = uVar6 - 1;
      uVar6 = uVar4;
    } while (this->str[lVar2] == c);
    return uVar4;
  }
  if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
    pcVar1 = (code *)swi(3);
    sVar5 = (*pcVar1)();
    return sVar5;
  }
  handle_error(0x230d59,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
               ,0x1749,"start == npos || (start >= 0 && start <= len)");
}

Assistant:

size_t last_not_of(const C c, size_t start=npos) const
    {
        C4_ASSERT(start == npos || (start >= 0 && start <= len));
        if(start == npos)
            start = len;
        for(size_t i = start-1; i != size_t(-1); --i)
        {
            if(str[i] != c)
                return i;
        }
        return npos;
    }